

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

Vec_Ptr_t * Vec_PtrDupStr(Vec_Ptr_t *pVec)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  Vec_Ptr_t *p;
  int i;
  Vec_Ptr_t *pVec_local;
  
  pVVar1 = Vec_PtrDup(pVec);
  for (p._4_4_ = 0; p._4_4_ < pVVar1->nSize; p._4_4_ = p._4_4_ + 1) {
    pcVar2 = Abc_UtilStrsav((char *)pVVar1->pArray[p._4_4_]);
    pVVar1->pArray[p._4_4_] = pcVar2;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Ptr_t * Vec_PtrDupStr( Vec_Ptr_t * pVec )
{
    int i;
    Vec_Ptr_t * p = Vec_PtrDup( pVec );
    for ( i = 0; i < p->nSize; i++ )
        p->pArray[i] = Abc_UtilStrsav( (char *)p->pArray[i] );
    return p;
}